

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_WrongTypeTreatedAsUnknown_Test::TestBody
          (UnknownFieldSetTest_WrongTypeTreatedAsUnknown_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_4b0;
  Message local_4a8;
  string local_4a0;
  string local_480;
  undefined1 local_460 [8];
  AssertionResult gtest_ar;
  AssertHelper local_430;
  Message local_428;
  string_view local_420;
  bool local_409;
  undefined1 local_408 [8];
  AssertionResult gtest_ar__1;
  string local_3f0;
  AssertHelper local_3d0;
  Message local_3c8;
  string_view local_3c0;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_;
  string bizarro_data;
  undefined1 local_368 [8];
  TestEmptyMessage empty_message;
  TestAllTypes all_types_message;
  UnknownFieldSetTest_WrongTypeTreatedAsUnknown_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)&empty_message.super_ZeroFieldsBase._impl_);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage((TestEmptyMessage *)local_368);
  UnknownFieldSetTest::GetBizarroData_abi_cxx11_
            ((string *)&gtest_ar_.message_,&this->super_UnknownFieldSetTest);
  local_3c0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&gtest_ar_.message_);
  local_3a9 = protobuf::MessageLite::ParseFromString
                        ((MessageLite *)&empty_message.super_ZeroFieldsBase._impl_,local_3c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3f0,(internal *)local_3a8,
               (AssertionResult *)"all_types_message.ParseFromString(bizarro_data)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x1e5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    testing::Message::~Message(&local_3c8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_420 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&gtest_ar_.message_);
    local_409 = protobuf::MessageLite::ParseFromString((MessageLite *)local_368,local_420);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_408,&local_409,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
    if (!bVar1) {
      testing::Message::Message(&local_428);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_408,
                 (AssertionResult *)"empty_message.ParseFromString(bizarro_data)","false","true",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_430,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
                 ,0x1e6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_430,&local_428);
      testing::internal::AssertHelper::~AssertHelper(&local_430);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_428);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      Message::DebugString_abi_cxx11_(&local_480,(Message *)local_368);
      Message::DebugString_abi_cxx11_
                (&local_4a0,(Message *)&empty_message.super_ZeroFieldsBase._impl_);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_460,"empty_message.DebugString()",
                 "all_types_message.DebugString()",&local_480,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_480);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
      if (!bVar1) {
        testing::Message::Message(&local_4a8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
                   ,0x1ea,pcVar2);
        testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        testing::Message::~Message(&local_4a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  proto2_unittest::TestEmptyMessage::~TestEmptyMessage((TestEmptyMessage *)local_368);
  proto2_unittest::TestAllTypes::~TestAllTypes
            ((TestAllTypes *)&empty_message.super_ZeroFieldsBase._impl_);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, WrongTypeTreatedAsUnknown) {
  // Test that fields of the wrong wire type are treated like unknown fields
  // when parsing.

  unittest::TestAllTypes all_types_message;
  unittest::TestEmptyMessage empty_message;
  std::string bizarro_data = GetBizarroData();
  ASSERT_TRUE(all_types_message.ParseFromString(bizarro_data));
  ASSERT_TRUE(empty_message.ParseFromString(bizarro_data));

  // All fields should have been interpreted as unknown, so the debug strings
  // should be the same.
  EXPECT_EQ(empty_message.DebugString(), all_types_message.DebugString());
}